

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::Draw::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  VertexGrid *this_00;
  DrawCall DVar1;
  VkFormat format;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  _func_int *p_Var2;
  undefined4 *puVar3;
  _func_int **pp_Var4;
  VkImage image;
  ProgramCollection<vk::ProgramBinary> *pPVar5;
  _func_int **pp_Var6;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data_00;
  VkImageSubresourceRange subresourceRange;
  TextureFormat *pTVar7;
  Operation *pOVar8;
  Buffer *pBVar9;
  GraphicsPipelineBuilder *pGVar10;
  ProgramBinary *pPVar11;
  VkDeviceSize __new_size;
  TextureFormat TVar12;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  PixelBufferAccess imagePixels;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *local_1a8;
  TextureFormat *local_1a0;
  TextureFormat *local_198;
  OperationContext *local_190;
  VkClearValue local_188;
  undefined8 local_178;
  int aiStack_170 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_168;
  TextureFormat *local_160;
  TextureFormat *local_158;
  TextureFormat *local_150;
  VertexGrid *local_148;
  MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_140;
  GraphicsPipelineBuilder local_138;
  
  local_140 = __return_storage_ptr__;
  pOVar8 = (Operation *)operator_new(0x158);
  DVar1 = this->m_drawCall;
  pOVar8->_vptr_Operation = (_func_int **)&PTR__Implementation_00bdd530;
  pOVar8[1]._vptr_Operation = (_func_int **)context;
  pOVar8[2]._vptr_Operation = (_func_int **)resource;
  *(DrawCall *)&pOVar8[3]._vptr_Operation = DVar1;
  this_00 = (VertexGrid *)(pOVar8 + 4);
  VertexGrid::VertexGrid(this_00,context);
  local_168 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pOVar8 + 0xc);
  local_1a8 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)(pOVar8 + 0xf);
  local_150 = (TextureFormat *)(pOVar8 + 0x13);
  pOVar8[0x15]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x16]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x13]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x14]._vptr_Operation = (_func_int **)0x0;
  local_198 = (TextureFormat *)(pOVar8 + 0x1b);
  local_158 = (TextureFormat *)(pOVar8 + 0x1f);
  local_1a0 = (TextureFormat *)(pOVar8 + 0x23);
  local_160 = (TextureFormat *)(pOVar8 + 0x27);
  pOVar8[0xc]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0xd]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0xe]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0xf]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x1b]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x1c]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x1d]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x1e]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x1f]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x20]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x21]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x22]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x23]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x24]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x25]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x26]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x27]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x28]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x29]._vptr_Operation = (_func_int **)0x0;
  pOVar8[0x2a]._vptr_Operation = (_func_int **)0x0;
  vk = context->m_vk;
  device = context->m_device;
  allocator = context->m_allocator;
  local_190 = context;
  local_148 = this_00;
  if (*(int *)&pOVar8[3]._vptr_Operation == 3) {
    pBVar9 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_138,0x14,0x100);
    synchronization::Buffer::Buffer
              (pBVar9,vk,device,allocator,(VkBufferCreateInfo *)&local_138,(MemoryRequirement)0x1);
    imagePixels.super_ConstPixelBufferAccess.m_format.order = R;
    imagePixels.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    data_00.ptr._4_4_ = in_stack_fffffffffffffe0c;
    data_00.ptr._0_4_ = in_stack_fffffffffffffe08;
    data_00._8_4_ = in_stack_fffffffffffffe10;
    data_00._12_4_ = in_stack_fffffffffffffe14;
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    assignData(local_1a8,data_00);
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    ~UniqueBase((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                 *)&imagePixels);
    p_Var2 = pOVar8[0xf]._vptr_Operation[4];
    puVar3 = *(undefined4 **)(p_Var2 + 0x18);
    *puVar3 = (int)((ulong)((long)pOVar8[6]._vptr_Operation - (long)pOVar8[5]._vptr_Operation) >> 4)
    ;
    *(undefined8 *)(puVar3 + 1) = 1;
    *(undefined8 *)(puVar3 + 3) = 0;
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(p_Var2 + 8),*(VkDeviceSize *)(p_Var2 + 0x10),
               0x14);
  }
  else if (*(int *)&pOVar8[3]._vptr_Operation == 2) {
    pBVar9 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_138,0x10,0x100);
    synchronization::Buffer::Buffer
              (pBVar9,vk,device,allocator,(VkBufferCreateInfo *)&local_138,(MemoryRequirement)0x1);
    imagePixels.super_ConstPixelBufferAccess.m_format.order = R;
    imagePixels.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    data.ptr._4_4_ = in_stack_fffffffffffffe0c;
    data.ptr._0_4_ = in_stack_fffffffffffffe08;
    data._8_4_ = in_stack_fffffffffffffe10;
    data._12_4_ = in_stack_fffffffffffffe14;
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    assignData(local_1a8,data);
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    ~UniqueBase((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                 *)&imagePixels);
    p_Var2 = pOVar8[0xf]._vptr_Operation[4];
    puVar3 = *(undefined4 **)(p_Var2 + 0x18);
    *puVar3 = (int)((ulong)((long)pOVar8[6]._vptr_Operation - (long)pOVar8[5]._vptr_Operation) >> 4)
    ;
    *(undefined8 *)(puVar3 + 1) = 1;
    puVar3[3] = 0;
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(p_Var2 + 8),*(VkDeviceSize *)(p_Var2 + 0x10),
               0x10);
  }
  pp_Var4 = pOVar8[2]._vptr_Operation;
  format = *(VkFormat *)(pp_Var4 + 0xb);
  *(VkFormat *)&pOVar8[0x11]._vptr_Operation = format;
  pp_Var6 = *(_func_int ***)((long)pp_Var4 + 100);
  pOVar8[0x17]._vptr_Operation = *(_func_int ***)((long)pp_Var4 + 0x5c);
  pOVar8[0x18]._vptr_Operation = pp_Var6;
  *(undefined4 *)&pOVar8[0x19]._vptr_Operation = *(undefined4 *)((long)pp_Var4 + 0x6c);
  image.m_internal = (deUint64)pp_Var4[8];
  pOVar8[0x12]._vptr_Operation = (_func_int **)image.m_internal;
  *(undefined4 *)((long)&pOVar8[0x1a]._vptr_Operation + 4) = *(undefined4 *)(pp_Var4 + 10);
  *(_func_int **)((long)&pOVar8[0x19]._vptr_Operation + 4) = pp_Var4[9];
  subresourceRange.baseArrayLayer = (int)((ulong)pOVar8[0x18]._vptr_Operation >> 0x20);
  subresourceRange._0_12_ = *(undefined1 (*) [12])(pOVar8 + 0x17);
  subresourceRange.layerCount = *(deUint32 *)&pOVar8[0x19]._vptr_Operation;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&imagePixels,vk,device,image,
                VK_IMAGE_VIEW_TYPE_2D,format,subresourceRange);
  pTVar7 = local_150;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imagePixels.super_ConstPixelBufferAccess._16_8_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
  local_138.m_renderSize.m_data[0] = imagePixels.super_ConstPixelBufferAccess.m_format.order;
  local_138.m_renderSize.m_data[1] = imagePixels.super_ConstPixelBufferAccess.m_format.type;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal._0_4_ = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0];
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal._4_4_ = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1];
  imagePixels.super_ConstPixelBufferAccess.m_format.order = R;
  imagePixels.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_150);
  pTVar7[2] = (TextureFormat)
              local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pTVar7[3] = (TextureFormat)
              local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pTVar7->order = local_138.m_renderSize.m_data[0];
  pTVar7->type = local_138.m_renderSize.m_data[1];
  pTVar7[1].order =
       (undefined4)
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pTVar7[1].type =
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&imagePixels);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&imagePixels,vk,device,
                 *(VkFormat *)&pOVar8[0x11]._vptr_Operation);
  pTVar7 = local_198;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imagePixels.super_ConstPixelBufferAccess._16_8_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
  local_138.m_renderSize.m_data[0] = imagePixels.super_ConstPixelBufferAccess.m_format.order;
  local_138.m_renderSize.m_data[1] = imagePixels.super_ConstPixelBufferAccess.m_format.type;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal._0_4_ = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0];
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal._4_4_ = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1];
  imagePixels.super_ConstPixelBufferAccess.m_format.order = R;
  imagePixels.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_198);
  pTVar7[2] = (TextureFormat)
              local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pTVar7[3] = (TextureFormat)
              local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pTVar7->order = local_138.m_renderSize.m_data[0];
  pTVar7->type = local_138.m_renderSize.m_data[1];
  pTVar7[1].order =
       (undefined4)
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pTVar7[1].type =
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&imagePixels);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&imagePixels,vk,device,
                  (VkRenderPass)pOVar8[0x1b]._vptr_Operation,
                  (VkImageView)pOVar8[0x13]._vptr_Operation,
                  *(deUint32 *)((long)&pOVar8[0x19]._vptr_Operation + 4),
                  *(deUint32 *)&pOVar8[0x1a]._vptr_Operation,1);
  pTVar7 = local_158;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imagePixels.super_ConstPixelBufferAccess._16_8_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
  local_138.m_renderSize.m_data[0] = imagePixels.super_ConstPixelBufferAccess.m_format.order;
  local_138.m_renderSize.m_data[1] = imagePixels.super_ConstPixelBufferAccess.m_format.type;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal._0_4_ = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0];
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal._4_4_ = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1];
  imagePixels.super_ConstPixelBufferAccess.m_format.order = R;
  imagePixels.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_158);
  pTVar7[2] = (TextureFormat)
              local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pTVar7[3] = (TextureFormat)
              local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pTVar7->order = local_138.m_renderSize.m_data[0];
  pTVar7->type = local_138.m_renderSize.m_data[1];
  pTVar7[1].order =
       (undefined4)
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pTVar7[1].type =
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&imagePixels);
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&imagePixels,vk,device);
  pTVar7 = local_1a0;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imagePixels.super_ConstPixelBufferAccess._16_8_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
  local_138.m_renderSize.m_data[0] = imagePixels.super_ConstPixelBufferAccess.m_format.order;
  local_138.m_renderSize.m_data[1] = imagePixels.super_ConstPixelBufferAccess.m_format.type;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal._0_4_ = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0];
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal._4_4_ = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1];
  imagePixels.super_ConstPixelBufferAccess.m_format.order = R;
  imagePixels.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_1a0);
  pTVar7[2] = (TextureFormat)
              local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_deviceIface;
  pTVar7[3] = (TextureFormat)
              local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
              deleter.m_device;
  pTVar7->order = local_138.m_renderSize.m_data[0];
  pTVar7->type = local_138.m_renderSize.m_data[1];
  pTVar7[1].order =
       (undefined4)
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  pTVar7[1].type =
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&imagePixels);
  memset(&local_138.m_vertexShaderModule,0,0xf4);
  local_138.m_patchControlPoints = 1;
  local_138.m_blendEnable = false;
  local_138.m_primitiveTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_138.m_renderSize.m_data = *(int (*) [2])((long)&pOVar8[0x19]._vptr_Operation + 4);
  pGVar10 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      (&local_138,*(VkFormat *)&pOVar8[4]._vptr_Operation,
                       *(deUint32 *)((long)&pOVar8[4]._vptr_Operation + 4));
  pPVar5 = local_190->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&imagePixels,"draw_vert",&local_1a9);
  pPVar11 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,(string *)&imagePixels);
  pGVar10 = GraphicsPipelineBuilder::setShader
                      (pGVar10,vk,device,VK_SHADER_STAGE_VERTEX_BIT,pPVar11,
                       (VkSpecializationInfo *)0x0);
  pPVar5 = local_190->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188.depthStencil,"draw_frag",&local_1aa);
  pPVar11 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                      (pPVar5,(string *)&local_188.depthStencil);
  GraphicsPipelineBuilder::setShader
            (pGVar10,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar11,(VkSpecializationInfo *)0x0);
  std::__cxx11::string::~string((string *)&local_188.depthStencil);
  std::__cxx11::string::~string((string *)&imagePixels);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_188.depthStencil,&local_138,vk,device,
             (VkPipelineLayout)*local_1a0,(VkRenderPass)*local_198,local_190->m_pipelineCacheData);
  pTVar7 = local_160;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[2] = (int)local_178;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[0] = local_178._4_4_;
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[1] = aiStack_170[0];
  imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[2] = aiStack_170[1];
  imagePixels.super_ConstPixelBufferAccess.m_format.order =
       (ChannelOrder)local_188.depthStencil.depth;
  imagePixels.super_ConstPixelBufferAccess.m_format.type = local_188.depthStencil.stencil;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0] = local_188._8_4_;
  imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1] = local_188._12_4_;
  local_188 = (VkClearValue)ZEXT816(0);
  local_178 = 0;
  aiStack_170[0] = 0;
  aiStack_170[1] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_160);
  pTVar7[2].order = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[2];
  pTVar7[2].type = imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[0];
  pTVar7[3].order = imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[1];
  pTVar7[3].type = imagePixels.super_ConstPixelBufferAccess.m_pitch.m_data[2];
  *pTVar7 = imagePixels.super_ConstPixelBufferAccess.m_format;
  pTVar7[1].order = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[0];
  pTVar7[1].type = imagePixels.super_ConstPixelBufferAccess.m_size.m_data[1];
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_188.depthStencil);
  __new_size = getPixelBufferSize(*(VkFormat *)(pOVar8[2]._vptr_Operation + 0xb),
                                  (VkExtent3D *)(pOVar8[2]._vptr_Operation + 9));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_168,__new_size);
  TVar12 = ::vk::mapVkFormat(*(VkFormat *)&pOVar8[0x11]._vptr_Operation);
  local_188.depthStencil.depth = (float)TVar12.order;
  local_188.depthStencil.stencil = TVar12.type;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&imagePixels,(TextureFormat *)&local_188.depthStencil,
             *(int *)((long)&pOVar8[0x19]._vptr_Operation + 4),*(int *)&pOVar8[0x1a]._vptr_Operation
             ,*(int *)((long)&pOVar8[0x1a]._vptr_Operation + 4),pOVar8[0xc]._vptr_Operation);
  local_188 = makeClearValue(*(VkFormat *)&pOVar8[0x11]._vptr_Operation);
  clearPixelBuffer(&imagePixels,&local_188);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_138);
  (local_140->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar8;
  return local_140;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		return de::MovePtr<Operation>(new Implementation(context, resource, m_drawCall));
	}